

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_> *
miniscript::internal::ParseHexStrEnd<(anonymous_namespace)::KeyParser>
          (optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
           *__return_storage_ptr__,Span<const_char> in,size_t expected_size,KeyParser *ctx)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  internal *this;
  long in_FS_OFFSET;
  Span<const_char> sp;
  string_view hex_str;
  string_view str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> local_70;
  string val;
  
  this = (internal *)in.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  sp.m_data = (char *)in.m_size;
  uVar3 = FindNextChar(this,sp,(char)expected_size);
  if ((int)uVar3 < 1) {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
    ._M_engaged = false;
  }
  else {
    val._M_dataplus._M_p = (pointer)&val.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,this,this + uVar3);
    str._M_str = val._M_dataplus._M_p;
    str._M_len = val._M_string_length;
    bVar2 = IsHex(str);
    if (bVar2) {
      hex_str._M_str = val._M_dataplus._M_p;
      hex_str._M_len = val._M_string_length;
      ParseHex<unsigned_char>(&hash,hex_str);
      if ((long)hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == expected_size) {
        local_70.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_70.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_70.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_70.second = uVar3;
        std::optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>::
        optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true>
                  (__return_storage_ptr__,&local_70);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
        ._M_engaged = false;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
      ._M_engaged = false;
    }
    std::__cxx11::string::~string((string *)&val);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<std::vector<unsigned char>, int>> ParseHexStrEnd(Span<const char> in, const size_t expected_size,
                                                                         const Ctx& ctx)
{
    int hash_size = FindNextChar(in, ')');
    if (hash_size < 1) return {};
    std::string val = std::string(in.begin(), in.begin() + hash_size);
    if (!IsHex(val)) return {};
    auto hash = ParseHex(val);
    if (hash.size() != expected_size) return {};
    return {{std::move(hash), hash_size}};
}